

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O1

void lj_cdata_set(CTState *cts,CType *d,uint8_t *dp,TValue *o,CTInfo qual)

{
  uint uVar1;
  ulong uVar2;
  CType *d_00;
  
  uVar1 = d->info;
  if (uVar1 >> 0x1c == 10) {
    if (((uVar1 | qual) >> 0x19 & 1) == 0) {
      lj_cconv_bf_tv(cts,d,dp,o);
      return;
    }
  }
  else if (uVar1 >> 0x1c != 0xb) {
    uVar2 = (ulong)((uVar1 & 0xffff) << 4);
    uVar1 = *(uint *)((long)&cts->tab->info + uVar2);
    if ((uVar1 & 0xf0800000) == 0x20800000) {
      dp = *(uint8_t **)dp;
      uVar2 = (ulong)((uVar1 & 0xffff) << 4);
    }
    d_00 = (CType *)((long)&cts->tab->info + uVar2);
    if (((qual | d_00->info) >> 0x19 & 1) == 0) {
      lj_cconv_ct_tv(cts,d_00,dp,o,0);
      return;
    }
  }
  lj_err_caller(cts->L,LJ_ERR_FFI_WRCONST);
}

Assistant:

void lj_cdata_set(CTState *cts, CType *d, uint8_t *dp, TValue *o, CTInfo qual)
{
  if (ctype_isconstval(d->info)) {
    goto err_const;
  } else if (ctype_isbitfield(d->info)) {
    if (((d->info|qual) & CTF_CONST)) goto err_const;
    lj_cconv_bf_tv(cts, d, dp, o);
    return;
  }

  /* Get child type of pointer/array/field. */
  lj_assertCTS(ctype_ispointer(d->info) || ctype_isfield(d->info),
	       "pointer or field expected");
  d = ctype_child(cts, d);

  /* Resolve reference for field. */
  if (ctype_isref(d->info)) {
    lj_assertCTS(d->size == CTSIZE_PTR, "ref is not pointer-sized");
    dp = *(uint8_t **)dp;
    d = ctype_child(cts, d);
  }

  /* Skip attributes and collect qualifiers. */
  for (;;) {
    if (ctype_isattrib(d->info)) {
      if (ctype_attrib(d->info) == CTA_QUAL) qual |= d->size;
    } else {
      break;
    }
    d = ctype_child(cts, d);
  }

  lj_assertCTS(ctype_hassize(d->info), "store to ctype without size");
  lj_assertCTS(!ctype_isvoid(d->info), "store to void type");

  if (((d->info|qual) & CTF_CONST)) {
  err_const:
    lj_err_caller(cts->L, LJ_ERR_FFI_WRCONST);
  }

  lj_cconv_ct_tv(cts, d, dp, o, 0);
}